

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ModulationType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ModulationType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 extraout_EDX;
  KINT32 extraout_EDX_00;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Modulation:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\tSpread Spectrum:",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n\t\tFrequency Hop:    ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\t\tPsudo Noise:      ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\t\tTime Hop:         ",0x15);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tMajor Modulation Type:  ",0x1a);
  ENUMS::GetEnumAsStringRadioMajorModulation_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)this->m_ui16MajorModulationType,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tDetail:                 ",0x1a);
  paVar1 = &local_1c8.field_2;
  Value_00 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    Value_00 = extraout_EDX_00;
  }
  switch(this->m_ui16MajorModulationType) {
  case 1:
    ENUMS::GetEnumAsStringDetailAmplitude_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 2:
    ENUMS::GetEnumAsStringDetailAmplitudeAndAngle_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 3:
    ENUMS::GetEnumAsStringDetailAngle_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 4:
    ENUMS::GetEnumAsStringDetailCombination_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 5:
    ENUMS::GetEnumAsStringDetailPulse_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 6:
    ENUMS::GetEnumAsStringDetailUnmodulated_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  case 7:
    ENUMS::GetEnumAsStringDetailCarrierPhaseShift_abi_cxx11_
              (&local_1c8,(ENUMS *)(ulong)this->m_ui16Detail,Value_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    break;
  default:
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    goto LAB_00219e89;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
LAB_00219e89:
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n\tSystem:                 ",0x1a);
  ENUMS::GetEnumAsStringModulationSystem_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)this->m_ui16System,Value_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString ModulationType::GetAsString() const
{
    KStringStream ss;

    ss << "Modulation:\n"
       << "\tSpread Spectrum:"
       << "\n\t\tFrequency Hop:    "     << m_ui16FreqHop
       << "\n\t\tPsudo Noise:      "     << m_ui16PseudoNoise
       << "\n\t\tTime Hop:         "     << m_ui16TimeHop
       << "\n\tMajor Modulation Type:  " << GetEnumAsStringRadioMajorModulation( m_ui16MajorModulationType )
       << "\n\tDetail:                 ";

    switch( m_ui16MajorModulationType )
    {
    case Amplitude:
        ss << GetEnumAsStringDetailAmplitude( m_ui16Detail );
        break;

    case AmplitudeAndAngle:
        ss << GetEnumAsStringDetailAmplitudeAndAngle( m_ui16Detail );
        break;

    case Angle:
        ss << GetEnumAsStringDetailAngle( m_ui16Detail );
        break;

    case Combination:
        ss << GetEnumAsStringDetailCombination( m_ui16Detail );
        break;

    case Pulse:
        ss << GetEnumAsStringDetailPulse( m_ui16Detail );
        break;

    case Unmodulated:
        ss << GetEnumAsStringDetailUnmodulated( m_ui16Detail );
        break;

    case CarrierPhaseShiftModulation_CPSM:
        ss << GetEnumAsStringDetailCarrierPhaseShift( m_ui16Detail );
        break;

    default:
        ss << m_ui16Detail;
        break;
    }

    ss << "\n\tSystem:                 " << GetEnumAsStringModulationSystem( m_ui16System )
       << "\n";

    return ss.str();
}